

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall SmallArray<char,_128U>::~SmallArray(SmallArray<char,_128U> *this)

{
  char *pcVar1;
  
  pcVar1 = this->data;
  if (pcVar1 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (pcVar1 != (char *)0x0) {
        (*(code *)NULLC::dealloc)(pcVar1);
      }
    }
    else if (pcVar1 != (char *)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  return;
}

Assistant:

~SmallArray()
	{
		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}
	}